

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

bool __thiscall
tchecker::system::process_events_map_t::contains
          (process_events_map_t *this,process_id_t pid,event_id_t event_id)

{
  pointer pfVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  pointer local_20;
  
  uVar2 = (ulong)pid;
  pfVar1 = (this->_map).
           super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_map).
                 super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 3) *
          -0x5555555555555555;
  if (uVar3 < uVar2 || uVar3 - uVar2 == 0) {
    bVar4 = false;
  }
  else {
    boost::container::dtl::
    flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
    ::find((flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
            *)&local_20,(key_type *)(pfVar1 + uVar2));
    pfVar1 = (this->_map).
             super__Vector_base<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = local_20 !=
            (pointer)(*(stored_size_type *)
                       ((long)&pfVar1[uVar2].
                               super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                               .m_data + 8) * 4 +
                     *(long *)&pfVar1[uVar2].
                               super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                               .m_data);
  }
  return bVar4;
}

Assistant:

bool process_events_map_t::contains(tchecker::process_id_t pid, tchecker::event_id_t event_id)
{
  if (pid >= _map.size())
    return false;
  return (_map[pid].find(event_id) != _map[pid].end());
}